

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O2

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *b;
  uint uVar1;
  pointer pvVar2;
  type_conflict6 tVar3;
  type_conflict6 tVar4;
  int iVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *v;
  unsigned_long uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  h;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_int,_void>
  local_128 [3];
  undefined1 local_d8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_c8;
  type tStack_c0;
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  bool local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_80;
  
  std::mutex::lock(&(this->m_mutex).m_);
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)local_d8,1,(type *)0x0);
    local_128[0].arg3 = -uVar1;
    local_128[0].arg1 = (type)&local_80;
    local_128[0].arg2 = (type)local_d8;
    multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
    ::
    number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,int,void>
              (&h,local_128,(type *)0x0);
    b = &this->m_t_max;
    tStack_c0.arg1 = 2;
    local_d8._0_8_ = local_128;
    local_d8._8_8_ = b;
    local_c8 = &h;
    tStack_c0.arg2 = &h;
    iVar5 = itrunc<boost::multiprecision::detail::expression<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>,void,void>>
                      ((expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>,_void,_void>
                        *)local_d8);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_abscissas).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar1,(long)iVar5);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_weights).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar1,(long)iVar5);
    local_a8[0] = h.m_backend.data._M_elems[0xc];
    local_a8[1] = h.m_backend.data._M_elems[0xd];
    auStack_a0[0] = h.m_backend.data._M_elems[0xe];
    auStack_a0[1] = h.m_backend.data._M_elems[0xf];
    tStack_c0.arg2 = (type)h.m_backend.data._M_elems._32_8_;
    auStack_b0[0] = h.m_backend.data._M_elems[10];
    auStack_b0[1] = h.m_backend.data._M_elems[0xb];
    local_c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)h.m_backend.data._M_elems._16_8_;
    tStack_c0.arg1 = h.m_backend.data._M_elems[6];
    tStack_c0._4_4_ = h.m_backend.data._M_elems[7];
    local_d8._0_4_ = h.m_backend.data._M_elems[0];
    local_d8._4_4_ = h.m_backend.data._M_elems[1];
    local_d8._8_4_ = h.m_backend.data._M_elems[2];
    local_d8._12_4_ = h.m_backend.data._M_elems[3];
    local_98 = h.m_backend.exp;
    local_94 = h.m_backend.neg;
    local_90 = h.m_backend.fpclass;
    iStack_8c = h.m_backend.prec_elem;
    uVar6 = 0;
    while( true ) {
      tVar3 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)local_d8,b);
      if (!tVar3) break;
      tVar3 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)local_d8,&this->m_t_crossover);
      pvVar2 = (this->m_abscissas).
               super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar4 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)local_d8,&this->m_t_crossover);
      if (tVar4) {
        abscissa_at_t((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                       *)local_128,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                       *)local_d8);
      }
      else {
        abscissa_complement_at_t
                  (&local_80,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_d8);
        multiprecision::operator-
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_128,(multiprecision *)&local_80,v);
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
      ::
      emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  *)(pvVar2 + uVar1),
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_128);
      local_128[0].arg1 = (type)CONCAT44(local_128[0].arg1._4_4_,2);
      local_128[0].arg2 = &h;
      multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)local_d8,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_128);
      uVar6 = uVar6 + tVar3;
    }
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar1] = uVar6;
    local_a8[0] = h.m_backend.data._M_elems[0xc];
    local_a8[1] = h.m_backend.data._M_elems[0xd];
    auStack_a0[0] = h.m_backend.data._M_elems[0xe];
    auStack_a0[1] = h.m_backend.data._M_elems[0xf];
    tStack_c0.arg2 = (type)h.m_backend.data._M_elems._32_8_;
    auStack_b0[0] = h.m_backend.data._M_elems[10];
    auStack_b0[1] = h.m_backend.data._M_elems[0xb];
    local_c8 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)h.m_backend.data._M_elems._16_8_;
    tStack_c0.arg1 = h.m_backend.data._M_elems[6];
    tStack_c0._4_4_ = h.m_backend.data._M_elems[7];
    local_d8._0_4_ = h.m_backend.data._M_elems[0];
    local_d8._4_4_ = h.m_backend.data._M_elems[1];
    local_d8._8_4_ = h.m_backend.data._M_elems[2];
    local_d8._12_4_ = h.m_backend.data._M_elems[3];
    local_98 = h.m_backend.exp;
    local_94 = h.m_backend.neg;
    local_90 = h.m_backend.fpclass;
    iStack_8c = h.m_backend.prec_elem;
    while( true ) {
      tVar3 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)local_d8,b);
      if (!tVar3) break;
      pvVar2 = (this->m_weights).
               super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      weight_at_t((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)local_128,
                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *)local_d8);
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
      ::
      emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  *)(pvVar2 + uVar1),
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_128);
      local_128[0].arg1 = (type)CONCAT44(local_128[0].arg1._4_4_,2);
      local_128[0].arg2 = &h;
      multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
      ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)local_d8,
                   (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_128);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }